

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O2

ON_Object * __thiscall ON_RenderContent::Internal_DeepCopy(ON_RenderContent *this)

{
  return (ON_Object *)0x0;
}

Assistant:

ON_RenderContent::ON_RenderContent(const wchar_t* kind)
  :
  ON_ModelComponent(ON_ModelComponent::Type::RenderContent)
{
  _private = new (_PRIVATE) ON_RenderContentPrivate(*this, kind); PRIVATE_CHECK(ON_RenderContentPrivate);

  // Set a unique instance id.
  ON_UUID uuid;
  ON_CreateUuid(uuid);
  SetId(uuid);

  // Set the plug-in id to the RDK plug-in id.
  _private->InternalSetPropertyValue(ON_RENDER_CONTENT_PLUG_IN_ID, RdkPlugInId());

  // Set the render engine id to 'universal'.
  _private->InternalSetPropertyValue(ON_RENDER_CONTENT_RENDER_ENGINE_ID, ON_UniversalRenderEngineId);
}